

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.c
# Opt level: O1

int spi_open(int argc,char **argv)

{
  int iVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined8 extraout_RDX;
  undefined4 uVar4;
  char *pcVar5;
  ulong uVar6;
  uint8_t buf [10];
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 *puStack_e8;
  undefined8 uStack_e0;
  undefined4 uStack_d8;
  uint32_t uStack_d4;
  uint16_t uStack_d0;
  uint8_t uStack_ce;
  undefined4 uStack_cd;
  undefined1 uStack_c9;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined4 uStack_b8;
  uint32_t uStack_b4;
  uint16_t uStack_b0;
  uint8_t uStack_ae;
  undefined4 uStack_ad;
  undefined1 uStack_a9;
  code *pcStack_a8;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 *puStack_90;
  undefined8 uStack_88;
  undefined4 uStack_80;
  uint32_t uStack_7c;
  uint16_t uStack_78;
  uint8_t uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined2 uStack_72;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined4 uStack_60;
  uint32_t uStack_5c;
  uint16_t uStack_58;
  uint8_t uStack_56;
  undefined4 uStack_55;
  undefined1 uStack_51;
  code *pcStack_50;
  undefined8 local_40;
  undefined2 local_38;
  
  do {
    while( true ) {
      pcStack_50 = (code *)0x101982;
      iVar1 = getopt_long(argc,argv,"D:s:d:b:i:o:lHOLC3NR24p:v",parse_opts_lopts,0);
      if (0x61 < iVar1) break;
      if (iVar1 < 0x34) {
        if (iVar1 == 0x32) {
          mode = mode | 0x100;
        }
        else {
          if (iVar1 != 0x33) {
            if (iVar1 == -1) {
              if ((mode & 0x20) != 0) {
                if ((mode >> 8 & 1) != 0) {
                  mode = mode | 0x400;
                }
                if ((mode >> 9 & 1) != 0) {
                  mode = mode | 0x800;
                }
              }
              uVar4 = 2;
              pcStack_50 = (code *)0x101b45;
              pcVar5 = device;
              i2s_fd = open(device,2);
              if (i2s_fd < 0) {
                pcStack_50 = (code *)0x101d25;
                spi_open_cold_7();
LAB_00101d25:
                pcStack_50 = (code *)0x101d2a;
                spi_open_cold_6();
LAB_00101d2a:
                pcStack_50 = (code *)0x101d2f;
                spi_open_cold_5();
LAB_00101d2f:
                pcStack_50 = (code *)0x101d34;
                spi_open_cold_4();
LAB_00101d34:
                pcStack_50 = (code *)0x101d39;
                spi_open_cold_3();
              }
              else {
                pcStack_50 = (code *)0x101b5f;
                puts("spi open");
                pcVar5 = (char *)(ulong)(uint)i2s_fd;
                uVar4 = 0x40046b05;
                pcStack_50 = (code *)0x101b78;
                iVar1 = ioctl(i2s_fd,0x40046b05,&mode);
                if (iVar1 == -1) goto LAB_00101d25;
                pcVar5 = (char *)(ulong)(uint)i2s_fd;
                uVar4 = 0x80046b05;
                pcStack_50 = (code *)0x101ba1;
                iVar1 = ioctl(i2s_fd,0x80046b05,&mode);
                if (iVar1 == -1) goto LAB_00101d2a;
                pcVar5 = (char *)(ulong)(uint)i2s_fd;
                uVar4 = 0x40016b03;
                pcStack_50 = (code *)0x101bc3;
                iVar1 = ioctl(i2s_fd,0x40016b03,&bits);
                if (iVar1 == -1) goto LAB_00101d2f;
                pcVar5 = (char *)(ulong)(uint)i2s_fd;
                uVar4 = 0x80016b03;
                pcStack_50 = (code *)0x101be5;
                iVar1 = ioctl(i2s_fd,0x80016b03,&bits);
                if (iVar1 == -1) goto LAB_00101d34;
                pcVar5 = (char *)(ulong)(uint)i2s_fd;
                uVar4 = 0x40046b04;
                pcStack_50 = (code *)0x101c07;
                iVar1 = ioctl(i2s_fd,0x40046b04,&speed);
                if (iVar1 != -1) {
                  pcVar5 = (char *)(ulong)(uint)i2s_fd;
                  uVar4 = 0x80046b04;
                  pcStack_50 = (code *)0x101c2e;
                  iVar1 = ioctl(i2s_fd,0x80046b04,&speed);
                  if (iVar1 != -1) {
                    pcStack_50 = (code *)0x101c4b;
                    printf("spi mode: 0x%x\n",(ulong)mode);
                    pcStack_50 = (code *)0x101c60;
                    printf("bits per word: %d\n",(ulong)bits);
                    pcStack_50 = (code *)0x101c7f;
                    printf("max speed: %d Hz (%d KHz)\n",(ulong)speed,(ulong)speed / 1000);
                    local_38 = 0;
                    local_40 = 0;
                    pcStack_50 = (code *)0x101ca4;
                    write(i2s_fd,&local_40,10);
                    pcStack_50 = (code *)0x101cae;
                    usleep(1000);
                    pcStack_50 = (code *)0x101cc1;
                    write(i2s_fd,&local_40,10);
                    pcStack_50 = (code *)0x101ccb;
                    usleep(1000);
                    pcStack_50 = (code *)0x101cde;
                    write(i2s_fd,&local_40,10);
                    pcStack_50 = (code *)0x101ce8;
                    usleep(1000);
                    return 0;
                  }
                  goto LAB_00101d3e;
                }
              }
              pcStack_50 = (code *)0x101d3e;
              spi_open_cold_2();
LAB_00101d3e:
              pcStack_50 = spi_read;
              spi_open_cold_1();
              uStack_7c = speed;
              uStack_78 = delay;
              uStack_76 = bits;
              uStack_75 = 0;
              uStack_74 = 0;
              uStack_73 = 0;
              uStack_72 = 0;
              uStack_70 = 0;
              uStack_6d = 0;
              uStack_5c = speed;
              uStack_58 = delay;
              uStack_56 = bits;
              uStack_55 = 0;
              uStack_51 = 0;
              puStack_90 = &uStack_93;
              uStack_93 = 1;
              uStack_92 = (undefined1)(((ulong)pcVar5 & 0xffffffff) >> 8);
              uStack_91 = (undefined1)((ulong)pcVar5 & 0xffffffff);
              uStack_80 = 3;
              uVar2 = 4;
              if (((mode >> 9 & 1) != 0) || (uVar2 = 2, (mode >> 8 & 1) != 0)) {
                uStack_74 = uVar2;
              }
              uVar2 = 4;
              if (((mode >> 0xb & 1) != 0) || (uVar2 = 2, (mode >> 10 & 1) != 0)) {
                uStack_73 = uVar2;
              }
              if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
                puStack_90 = (undefined1 *)0x0;
              }
              uStack_88 = 0;
              uVar6 = (ulong)(uint)i2s_fd;
              uStack_b8 = 0x40406b00;
              pcStack_a8 = (code *)0x101e33;
              uStack_60 = uVar4;
              iVar1 = ioctl(i2s_fd,0x40406b00,&puStack_90);
              if (iVar1 < 1) {
                pcStack_a8 = spi_write;
                spi_read_cold_1();
                uStack_e0 = 0;
                uStack_d4 = speed;
                uStack_d0 = delay;
                uStack_ce = bits;
                uStack_cd = 0;
                uStack_c9 = 0;
                uStack_b4 = speed;
                uStack_b0 = delay;
                uStack_ae = bits;
                uStack_ad = 0;
                uStack_a9 = 0;
                puStack_e8 = &uStack_eb;
                uStack_eb = 0;
                uStack_ea = (undefined1)((uVar6 & 0xffffffff) >> 8);
                uStack_e9 = (undefined1)(uVar6 & 0xffffffff);
                uStack_d8 = 3;
                bVar3 = 4;
                if (((mode >> 9 & 1) != 0) || (bVar3 = 2, (mode >> 8 & 1) != 0)) {
                  uStack_ad = (uint)bVar3 << 8;
                }
                uVar2 = 4;
                if (((mode >> 0xb & 1) != 0) || (uVar2 = 2, (mode >> 10 & 1) != 0)) {
                  uStack_ad = (uint)CONCAT12(uVar2,(undefined2)uStack_ad);
                }
                uStack_c8 = extraout_RDX;
                if ((((mode & 0x20) == 0) && ((mode & 0x300) == 0)) && ((mode & 0xc00) != 0)) {
                  uStack_c8 = 0;
                }
                uStack_c0 = 0;
                iVar1 = ioctl(i2s_fd,0x40406b00,&puStack_e8);
                if (iVar1 < 1) {
                  spi_write_cold_1();
                  halt_baddata();
                }
                return 0;
              }
              return 0;
            }
            goto switchD_0010199f_caseD_45;
          }
          mode = mode | 0x10;
        }
      }
      else {
        switch(iVar1) {
        case 0x43:
          mode = mode | 4;
          break;
        case 0x44:
          device = _optarg;
          break;
        case 0x45:
        case 0x46:
        case 0x47:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4d:
        case 0x50:
        case 0x51:
          goto switchD_0010199f_caseD_45;
        case 0x48:
          mode = mode | 1;
          break;
        case 0x4c:
          mode = mode | 8;
          break;
        case 0x4e:
          mode = mode | 0x40;
          break;
        case 0x4f:
          mode = mode | 2;
          break;
        case 0x52:
          mode = mode | 0x80;
          break;
        default:
          if (iVar1 != 0x34) goto switchD_0010199f_caseD_45;
          mode = mode | 0x200;
        }
      }
    }
    switch(iVar1) {
    case 0x62:
      pcStack_50 = (code *)0x1019cb;
      iVar1 = atoi(_optarg);
      bits = (uint8_t)iVar1;
      break;
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
      goto switchD_0010199f_caseD_45;
    case 100:
      pcStack_50 = (code *)0x101a6a;
      iVar1 = atoi(_optarg);
      delay = (uint16_t)iVar1;
      break;
    case 0x69:
      input_file = _optarg;
      break;
    case 0x6c:
      mode = mode | 0x20;
      break;
    case 0x6f:
      output_file = _optarg;
      break;
    case 0x70:
      input_tx = _optarg;
      break;
    default:
      if (iVar1 == 0x73) {
        pcStack_50 = (code *)0x101a85;
        speed = atoi(_optarg);
      }
      else if (iVar1 != 0x76) {
switchD_0010199f_caseD_45:
        pcStack_50 = (code *)0x101d0a;
        printf("Usage: %s [-DsbdlHOLC3]\n",*argv);
        pcStack_50 = (code *)0x101d16;
        puts(
            "  -D --device   device to use (default /dev/spidev1.1)\n  -s --speed    max speed (Hz)\n  -d --delay    delay (usec)\n  -b --bpw      bits per word\n  -i --input    input data from a file (e.g. \"test.bin\")\n  -o --output   output data to a file (e.g. \"results.bin\")\n  -l --loop     loopback\n  -H --cpha     clock phase\n  -O --cpol     clock polarity\n  -L --lsb      least significant bit first\n  -C --cs-high  chip select active high\n  -3 --3wire    SI/SO signals shared\n  -v --verbose  Verbose (show tx buffer)\n  -p            Send data (e.g. \"1234\\xde\\xad\")\n  -N --no-cs    no chip select\n  -R --ready    slave pulls low to pause\n  -2 --dual     dual transfer\n  -4 --quad     quad transfer\n"
            );
        pcStack_50 = (code *)0x101d20;
        exit(1);
      }
    }
  } while( true );
}

Assistant:

static int spi_open(int argc, char *argv[])
{
	int ret = 0;

	parse_opts(argc, argv);

	i2s_fd = open(device, O_RDWR);
	if (i2s_fd < 0) {
		pabort("can't open device");
		return 1;
	}
	else
	{
		printf("spi open\n");
	}

	/*
	 * spi mode
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_MODE32, &mode);
	if (ret == -1) {
		pabort("can't set spi mode");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_MODE32, &mode);
	if (ret == -1) {
		pabort("can't get spi mode");
		return 1;
	}

	/*
	 * bits per word
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_BITS_PER_WORD, &bits);
	if (ret == -1) {
		pabort("can't set bits per word");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_BITS_PER_WORD, &bits);
	if (ret == -1) {
		pabort("can't get bits per word");
		return 1;
	}

	/*
	 * max speed hz
	 */
	ret = ioctl(i2s_fd, SPI_IOC_WR_MAX_SPEED_HZ, &speed);
	if (ret == -1) {
		pabort("can't set max speed hz");
		return 1;
	}

	ret = ioctl(i2s_fd, SPI_IOC_RD_MAX_SPEED_HZ, &speed);
	if (ret == -1) {
		pabort("can't get max speed hz");
		return 1;
	}

	printf("spi mode: 0x%x\n", mode);
	printf("bits per word: %d\n", bits);
	printf("max speed: %d Hz (%d KHz)\n", speed, speed/1000);
	spi_mode_enable();
	return 0;
}